

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O0

void xmrig::JobResults::stop(void)

{
  void *pvVar1;
  JobResultsPrivate *unaff_retaddr;
  
  pvVar1 = xmrig::handler;
  if (xmrig::handler != (void *)0x0) {
    JobResultsPrivate::~JobResultsPrivate(unaff_retaddr);
    operator_delete(pvVar1);
  }
  xmrig::handler = (void *)0x0;
  return;
}

Assistant:

void xmrig::JobResults::stop()
{
    assert(handler != nullptr);

    delete handler;

    handler = nullptr;
}